

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_digest.hpp
# Opt level: O2

void __thiscall duckdb_tdigest::Centroid::add(Centroid *this,Centroid *c)

{
  double dVar1;
  Value VVar2;
  
  dVar1 = this->weight_;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    dVar1 = dVar1 + c->weight_;
    this->weight_ = dVar1;
    VVar2 = ((c->mean_ - this->mean_) * c->weight_) / dVar1 + this->mean_;
  }
  else {
    this->weight_ = c->weight_;
    VVar2 = c->mean_;
  }
  this->mean_ = VVar2;
  return;
}

Assistant:

inline void add(const Centroid &c) {
		//    CHECK_GT(c.weight_, 0);
		if (weight_ != 0.0) {
			weight_ += c.weight_;
			mean_ += c.weight_ * (c.mean_ - mean_) / weight_;
		} else {
			weight_ = c.weight_;
			mean_ = c.mean_;
		}
	}